

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhosttx.cpp
# Opt level: O3

osfildef * __thiscall
CVmHostIfcText::find_resource
          (CVmHostIfcText *this,char *resname,size_t resnamelen,unsigned_long *res_size)

{
  int iVar1;
  size_t sVar2;
  CVmHashEntry *pCVar3;
  FILE *pFVar4;
  unsigned_long uVar5;
  size_t sVar6;
  char *pcVar7;
  char res_dir [4096];
  char buf [4096];
  char fname_buf [4096];
  char local_3038 [4096];
  char local_2038 [4096];
  char local_1038 [4104];
  
  memset(local_3038,0,0x1000);
  pcVar7 = this->res_dir_;
  if (pcVar7 == (char *)0x0) {
    if (*this->ext_ != (char *)0x0) {
      os_get_path_name(local_3038,0x1000,*this->ext_);
    }
  }
  else {
    sVar2 = strlen(pcVar7);
    sVar6 = 0xfff;
    if (sVar2 < 0xfff) {
      sVar6 = sVar2;
    }
    memcpy(local_3038,pcVar7,sVar6);
    local_3038[sVar6] = '\0';
  }
  pCVar3 = CVmHashTable::find(this->restab_,resname,resnamelen);
  if (pCVar3 == (CVmHashEntry *)0x0) {
    iVar1 = (*(this->super_CVmHostIfc)._vptr_CVmHostIfc[2])(this);
    if (3 < iVar1) {
      return (osfildef *)0x0;
    }
    sVar6 = 0xfff;
    if (resnamelen < 0xfff) {
      sVar6 = resnamelen;
    }
    memcpy(local_2038,resname,sVar6);
    local_2038[sVar6] = '\0';
    pcVar7 = local_1038;
    os_cvt_url_dir(pcVar7,0x1000,local_2038);
    iVar1 = os_is_file_absolute(pcVar7);
    if (iVar1 != 0) {
      return (osfildef *)0x0;
    }
    if (local_3038[0] == '\0') {
      return (osfildef *)0x0;
    }
    iVar1 = os_is_file_in_dir(pcVar7,local_3038,1,0);
    if (iVar1 == 0) {
      return (osfildef *)0x0;
    }
  }
  else {
    pcVar7 = pCVar3[1].str_;
    if (pcVar7 == (char *)0x0) {
      pFVar4 = fopen(this->ext_[*(int *)&pCVar3->field_0x24],"rb");
      if (pFVar4 != (FILE *)0x0) {
        fseek(pFVar4,(long)pCVar3[1]._vptr_CVmHashEntry,0);
      }
      *res_size = (unsigned_long)pCVar3[1].nxt_;
      return (osfildef *)pFVar4;
    }
  }
  iVar1 = os_is_file_absolute(pcVar7);
  if (iVar1 == 0) {
    if (local_3038[0] == '\0') {
      return (osfildef *)0x0;
    }
    os_build_full_path(local_2038,0x1000,local_3038,pcVar7);
  }
  else {
    sVar2 = strlen(pcVar7);
    sVar6 = 0xfff;
    if (sVar2 < 0xfff) {
      sVar6 = sVar2;
    }
    memcpy(local_2038,pcVar7,sVar6);
    local_2038[sVar6] = '\0';
  }
  pFVar4 = fopen(local_2038,"rb");
  if (pFVar4 == (FILE *)0x0) {
    return (osfildef *)0x0;
  }
  fseek(pFVar4,0,2);
  uVar5 = ftell(pFVar4);
  *res_size = uVar5;
  fseek(pFVar4,0,0);
  return (osfildef *)pFVar4;
}

Assistant:

osfildef *CVmHostIfcText::find_resource(const char *resname,
                                        size_t resnamelen,
                                        unsigned long *res_size)
{
    osfildef *fp;
    char buf[OSFNMAX];
    char *fname;
    char fname_buf[OSFNMAX];
    char res_dir[OSFNMAX] = "";

    /* 
     *   get the resource directory - if there's an explicit resource path
     *   specified, use that, otherwise use the image file folder 
     */
    if (res_dir_ != 0)
        lib_strcpy(res_dir, sizeof(res_dir), res_dir_);
    else if (ext_[0] != 0)
        os_get_path_name(res_dir, sizeof(res_dir), ext_[0]);

    /* try finding an entry in the resource map */
    CResEntry *entry = (CResEntry *)restab_->find(resname, resnamelen);
    if (entry != 0)
    {
        /* found it - check the type */
        if (entry->link_ == 0)
        {
            /* it's a stored binary resource - load it */
            fp = osfoprb(ext_[entry->fileno_], OSFTBIN);
            
            /* if that succeeded, seek to the start of the resource */
            if (fp != 0)
                osfseek(fp, entry->ofs_, OSFSK_SET);
            
            /* tell the caller the size of the resource */
            *res_size = entry->siz_;
            
            /* return the file handle */
            return fp;
        }
        else
        {
            /* it's a link to a local file */
            fname = entry->link_;
        }
    }
    else
    {
        /* 
         *   There's no entry in the resource map, so convert the resource
         *   name from the URL notation to local file system conventions, and
         *   look for a file with the given name.  This is allowed only if
         *   the file safety level setting is 3 (read only local directory
         *   access) or lower.  
         */
        if (get_io_safety_read() > 3)
            return 0;
        
        /*   
         *   Make a null-terminated copy of the resource name, limiting the
         *   copy to our buffer size.  
         */
        if (resnamelen > sizeof(buf) - 1)
            resnamelen = sizeof(buf) - 1;
        memcpy(buf, resname, resnamelen);
        buf[resnamelen] = '\0';

        /* convert the resource name to a URL */
        os_cvt_url_dir(fname_buf, sizeof(fname_buf), buf);
        fname = fname_buf;

        /* if that yields an absolute path, it's an error */
        if (os_is_file_absolute(fname))
            return 0;

        /* 
         *   If it's not in the resource file folder, it's also an error - we
         *   don't allow paths to parent folders via "..", for example.  If
         *   we don't have an resource file folder to compare it to, fail,
         *   since we can't properly sandbox it.  Resource files are always
         *   sandboxed to the resource directory, even if the file safety
         *   settings are less restrictive.
         */
        if (res_dir[0] == 0
            || !os_is_file_in_dir(fname, res_dir, TRUE, FALSE))
            return 0;
    }

    /* 
     *   If we get this far, it's because we have a local file name in
     *   'fname' that we need to look up.  
     */

    /* check the path for relativity */
    if (os_is_file_absolute(fname))
    {
        /* it's already an absolute, fully-qualified path - use it as-is */
        lib_strcpy(buf, sizeof(buf), fname);
    }
    else
    {
        /* 
         *   it's a relative path - make sure we have a resource directory
         *   for it to be relative to 
         */
        if (res_dir[0] == 0)
            return 0;

        /* 
         *   build the full path name by combining the image file path with
         *   the relative path we got from the resource name URL, as
         *   converted local file system conventions 
         */
        os_build_full_path(buf, sizeof(buf), res_dir, fname);
    }

    /* try opening the file */
    fp = osfoprb(buf, OSFTBIN);

    /* return failure if we couldn't find the file */
    if (fp == 0)
        return 0;

    /* 
     *   the entire file is the resource data, so figure out how big the file
     *   is, and tell the caller that the resource size is the file size 
     */
    osfseek(fp, 0, OSFSK_END);
    *res_size = osfpos(fp);

    /* 
     *   seek back to the start of the resource data (which is simply the
     *   start of the file, since the entire file is the resource data) 
     */
    osfseek(fp, 0, OSFSK_SET);
        
    /* return the file handle */
    return fp;
}